

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O0

void EntityRelationTask::er_mixed_decoding
               (search *sch,multi_ex *ec,v_array<unsigned_long> *predictions)

{
  uint uVar1;
  uint uVar2;
  size_type sVar3;
  size_t sVar4;
  unsigned_long *puVar5;
  v_array<unsigned_long> *in_RDX;
  vector<example_*,_std::allocator<example_*>_> *in_RSI;
  __type_conflict _Var6;
  ptag rel_index;
  uint32_t j;
  ptag i;
  uint32_t count;
  uint32_t t;
  uint32_t n_ent;
  undefined1 in_stack_0000034b;
  ptag in_stack_0000034c;
  v_array<unsigned_long> *in_stack_00000350;
  example *in_stack_00000358;
  search *in_stack_00000360;
  undefined1 in_stack_0000042b;
  ptag in_stack_0000042c;
  v_array<unsigned_long> *in_stack_00000430;
  example *in_stack_00000438;
  search *in_stack_00000440;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  
  std::vector<example_*,_std::allocator<example_*>_>::size(in_RSI);
  _Var6 = std::sqrt<unsigned_long>(0x473f2a);
  uVar1 = (uint)(long)((_Var6 + -1.0) * 0.5);
  local_20 = 0;
  do {
    sVar3 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RSI);
    if (sVar3 <= local_20) {
      return;
    }
    local_24 = 0;
    for (local_28 = 0; local_28 < uVar1; local_28 = local_28 + 1) {
      if (local_24 == local_20) {
        std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RSI,(ulong)local_28);
        sVar4 = predict_entity(in_stack_00000360,in_stack_00000358,in_stack_00000350,
                               in_stack_0000034c,(bool)in_stack_0000034b);
        puVar5 = v_array<unsigned_long>::operator[](in_RDX,(ulong)local_28);
        *puVar5 = sVar4;
        break;
      }
      for (local_2c = 0; local_24 = local_24 + 1, local_2c < local_28; local_2c = local_2c + 1) {
        if (local_24 == local_20) {
          uVar2 = ((uVar1 + (((uVar1 * 2 - local_2c) + -1) * local_2c >> 1) + local_28) - local_2c)
                  - 1;
          std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RSI,(ulong)uVar2);
          sVar4 = predict_relation(in_stack_00000440,in_stack_00000438,in_stack_00000430,
                                   in_stack_0000042c,(bool)in_stack_0000042b);
          puVar5 = v_array<unsigned_long>::operator[](in_RDX,(ulong)uVar2);
          *puVar5 = sVar4;
          break;
        }
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void er_mixed_decoding(Search::search& sch, multi_ex& ec, v_array<size_t>& predictions)
{
  // ec.size = #entity + #entity*(#entity-1)/2
  uint32_t n_ent = (uint32_t)((sqrt(ec.size() * 8 + 1) - 1) / 2);
  for (uint32_t t = 0; t < ec.size(); t++)
  {
    // Do entity recognition first
    uint32_t count = 0;
    for (ptag i = 0; i < n_ent; i++)
    {
      if (count == t)
      {
        predictions[i] = predict_entity(sch, ec[i], predictions, i);
        break;
      }
      count++;
      for (uint32_t j = 0; j < i; j++)
      {
        if (count == t)
        {
          ptag rel_index = (ptag)(n_ent + (2 * n_ent - j - 1) * j / 2 + i - j - 1);
          predictions[rel_index] = predict_relation(sch, ec[rel_index], predictions, rel_index);
          break;
        }
        count++;
      }
    }
  }
}